

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O3

REF_STATUS ref_face_make_canonical(REF_INT *original,REF_INT *canonical)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = ref_sort_insertion_int(4,original,canonical);
  if (uVar2 == 0) {
    iVar1 = canonical[1];
    if (*canonical != iVar1) {
      if (iVar1 != canonical[2]) {
        if (canonical[2] != canonical[3]) {
          return 0;
        }
        canonical[2] = iVar1;
      }
      canonical[1] = *canonical;
    }
    *canonical = -1;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",0x6b,
           "ref_face_make_canonical",(ulong)uVar2,"sort");
  }
  return uVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_face_make_canonical(REF_INT *original,
                                                  REF_INT *canonical) {
  RSS(ref_sort_insertion_int(4, original, canonical), "sort");

  if (canonical[0] == canonical[1]) {
    canonical[0] = REF_EMPTY;
    return REF_SUCCESS;
  }

  if (canonical[1] == canonical[2]) {
    canonical[1] = canonical[0];
    canonical[0] = REF_EMPTY;
    return REF_SUCCESS;
  }

  if (canonical[2] == canonical[3]) {
    canonical[2] = canonical[1];
    canonical[1] = canonical[0];
    canonical[0] = REF_EMPTY;
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}